

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::ParseTextureNameAndOption(string *texname,texture_option_t *texopt,char *linebuf)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  texture_type_t tVar5;
  real_t *z;
  char **token;
  byte bVar6;
  byte *pbVar7;
  undefined1 uVar8;
  real_t *y;
  real_t *x;
  real_t rVar9;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  double default_x;
  byte *local_e8;
  allocator local_dd;
  uint local_dc;
  real_t *local_d8;
  real_t *local_d0;
  string *local_c8;
  real_t *local_c0;
  real_t *local_b8;
  real_t *local_b0;
  real_t *local_a8;
  real_t *local_a0;
  real_t *local_98;
  real_t *local_90;
  real_t *local_88;
  real_t *local_80;
  string *local_78;
  string texture_name;
  string local_50;
  
  texture_name._M_dataplus._M_p = (pointer)&texture_name.field_2;
  local_80 = texopt->origin_offset;
  local_88 = texopt->origin_offset + 1;
  local_dc = 0;
  texture_name._M_string_length = 0;
  local_90 = texopt->origin_offset + 2;
  local_98 = texopt->scale;
  texture_name.field_2._M_local_buf[0] = '\0';
  local_a0 = texopt->scale + 1;
  local_a8 = texopt->scale + 2;
  local_b0 = texopt->turbulence;
  local_b8 = texopt->turbulence + 1;
  local_c0 = texopt->turbulence + 2;
  local_d0 = &texopt->brightness;
  local_d8 = &texopt->contrast;
  local_c8 = (string *)&texopt->colorspace;
  local_78 = texname;
LAB_00e58dc4:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              if (((byte)*linebuf < 0xe) && ((0x2401U >> ((byte)*linebuf & 0x1f) & 1) != 0)) {
                bVar6 = (byte)local_dc;
                if ((local_dc & 1) != 0) {
                  std::__cxx11::string::_M_assign((string *)local_78);
                }
                std::__cxx11::string::~string((string *)&texture_name);
                return (bool)(bVar6 & 1);
              }
              sVar3 = strspn(linebuf," \t");
              pbVar7 = (byte *)linebuf + sVar3;
              uVar8 = 0x80;
              local_e8 = pbVar7;
              iVar2 = strncmp((char *)pbVar7,"-blendu",7);
              if ((iVar2 != 0) || ((pbVar7[7] != 0x20 && (pbVar7[7] != 9)))) break;
              local_e8 = pbVar7 + 8;
              bVar1 = parseOnOff((char **)&local_e8,(bool)uVar8);
              texopt->blendu = bVar1;
              linebuf = (char *)local_e8;
            }
            uVar8 = 0x88;
            iVar2 = strncmp((char *)pbVar7,"-blendv",7);
            if ((iVar2 != 0) || ((pbVar7[7] != 0x20 && (pbVar7[7] != 9)))) break;
            local_e8 = pbVar7 + 8;
            bVar1 = parseOnOff((char **)&local_e8,(bool)uVar8);
            texopt->blendv = bVar1;
            linebuf = (char *)local_e8;
          }
          uVar8 = 0x90;
          iVar2 = strncmp((char *)pbVar7,"-clamp",6);
          if ((iVar2 != 0) || ((pbVar7[6] != 0x20 && (pbVar7[6] != 9)))) break;
          local_e8 = pbVar7 + 7;
          bVar1 = parseOnOff((char **)&local_e8,(bool)uVar8);
          texopt->clamp = bVar1;
          linebuf = (char *)local_e8;
        }
        iVar2 = strncmp((char *)pbVar7,"-boost",6);
        if ((iVar2 != 0) || ((pbVar7[6] != 0x20 && (pbVar7[6] != 9)))) break;
        local_e8 = pbVar7 + 7;
        rVar9 = parseReal((char **)&local_e8,1.0);
        texopt->sharpness = rVar9;
        linebuf = (char *)local_e8;
      }
      bVar6 = *pbVar7;
      if (bVar6 == 0x2d) break;
LAB_00e59007:
      iVar2 = strncmp((char *)pbVar7,"-type",5);
      if ((iVar2 == 0) && ((pbVar7[5] == 0x20 || (pbVar7[5] == 9)))) {
        pbVar7 = pbVar7 + 5;
        local_e8 = pbVar7;
        sVar3 = strspn((char *)pbVar7," \t");
        pbVar7 = pbVar7 + sVar3;
        local_e8 = pbVar7;
        sVar3 = strcspn((char *)pbVar7," \t\r");
        iVar2 = strncmp((char *)pbVar7,"cube_top",8);
        tVar5 = TEXTURE_TYPE_CUBE_TOP;
        if (iVar2 != 0) {
          iVar2 = strncmp((char *)pbVar7,"cube_bottom",0xb);
          tVar5 = TEXTURE_TYPE_CUBE_BOTTOM;
          if (iVar2 != 0) {
            iVar2 = strncmp((char *)pbVar7,"cube_left",9);
            tVar5 = TEXTURE_TYPE_CUBE_LEFT;
            if (iVar2 != 0) {
              iVar2 = strncmp((char *)pbVar7,"cube_right",10);
              tVar5 = TEXTURE_TYPE_CUBE_RIGHT;
              if (iVar2 != 0) {
                iVar2 = strncmp((char *)pbVar7,"cube_front",10);
                tVar5 = TEXTURE_TYPE_CUBE_FRONT;
                if (iVar2 != 0) {
                  iVar2 = strncmp((char *)pbVar7,"cube_back",9);
                  tVar5 = TEXTURE_TYPE_CUBE_BACK;
                  if (iVar2 != 0) {
                    iVar2 = strncmp((char *)pbVar7,"sphere",6);
                    tVar5 = (texture_type_t)(iVar2 == 0);
                  }
                }
              }
            }
          }
        }
        linebuf = (char *)(pbVar7 + sVar3);
        texopt->type = tVar5;
        local_e8 = (byte *)linebuf;
      }
      else {
        iVar2 = strncmp((char *)pbVar7,"-texres",7);
        if ((iVar2 == 0) && ((pbVar7[7] == 0x20 || (pbVar7[7] == 9)))) {
          local_e8 = pbVar7 + 7;
          iVar2 = parseInt((char **)&local_e8);
          texopt->texture_resolution = iVar2;
          linebuf = (char *)local_e8;
        }
        else {
          iVar2 = strncmp((char *)pbVar7,"-imfchan",8);
          if ((iVar2 == 0) && ((pbVar7[8] == 0x20 || (pbVar7[8] == 9)))) {
            local_e8 = pbVar7 + 9;
            sVar3 = strspn((char *)local_e8," \t");
            pbVar7 = pbVar7 + sVar3 + 9;
            local_e8 = pbVar7;
            sVar3 = strcspn((char *)pbVar7," \t\r");
            if (sVar3 == 1) {
              texopt->imfchan = *pbVar7;
            }
            linebuf = (char *)(pbVar7 + sVar3);
            local_e8 = (byte *)linebuf;
          }
          else if ((bVar6 == 0x2d) &&
                  (((pbVar7[1] == 0x6d && (pbVar7[2] == 0x6d)) &&
                   ((pbVar7[3] == 0x20 || (pbVar7[3] == 9)))))) {
            local_e8 = pbVar7 + 4;
            parseReal2(local_d0,local_d8,(char **)&local_e8,1.0,in_ZMM1._0_8_);
            linebuf = (char *)local_e8;
          }
          else {
            iVar2 = strncmp((char *)pbVar7,"-colorspace",0xb);
            if ((iVar2 == 0) && ((pbVar7[0xb] == 0x20 || (pbVar7[0xb] == 9)))) {
              local_e8 = pbVar7 + 0xc;
              parseString_abi_cxx11_(&local_50,(tinyobj *)&local_e8,token);
              std::__cxx11::string::operator=(local_c8,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              in_ZMM1._8_56_ = extraout_var_00;
              in_ZMM1._0_8_ = extraout_XMM1_Qa_00;
              linebuf = (char *)local_e8;
            }
            else {
              std::__cxx11::string::string((string *)&local_50,(char *)pbVar7,&local_dd);
              std::__cxx11::string::operator=((string *)&texture_name,(string *)&local_50);
              uVar4 = std::__cxx11::string::~string((string *)&local_50);
              in_ZMM1._8_56_ = extraout_var;
              in_ZMM1._0_8_ = extraout_XMM1_Qa;
              linebuf = (char *)(pbVar7 + texture_name._M_string_length);
              local_dc = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
              local_e8 = (byte *)linebuf;
            }
          }
        }
      }
    }
    if (((pbVar7[1] == 0x62) && (pbVar7[2] == 0x6d)) && ((pbVar7[3] == 0x20 || (pbVar7[3] == 9)))) {
      local_e8 = pbVar7 + 4;
      rVar9 = parseReal((char **)&local_e8,1.0);
      texopt->bump_multiplier = rVar9;
      linebuf = (char *)local_e8;
      goto LAB_00e58dc4;
    }
    if ((pbVar7[1] == 0x6f) &&
       ((z = local_90, y = local_88, x = local_80, pbVar7[2] == 0x20 || (pbVar7[2] == 9)))) {
LAB_00e58fe6:
      auVar10 = ZEXT816(0) << 0x40;
      default_x = 0.0;
    }
    else {
      if ((pbVar7[1] != 0x73) || ((pbVar7[2] != 0x20 && (pbVar7[2] != 9)))) {
        if ((pbVar7[1] != 0x74) ||
           ((z = local_c0, y = local_b8, x = local_b0, pbVar7[2] != 0x20 && (pbVar7[2] != 9))))
        goto LAB_00e59007;
        goto LAB_00e58fe6;
      }
      auVar10 = ZEXT816(0x3ff0000000000000);
      default_x = 1.0;
      z = local_a8;
      y = local_a0;
      x = local_98;
    }
    local_e8 = pbVar7 + 3;
    in_ZMM1 = ZEXT1664(auVar10);
    parseReal3(x,y,z,(char **)&local_e8,default_x,auVar10._0_8_,default_x);
    linebuf = (char *)local_e8;
  } while( true );
}

Assistant:

bool ParseTextureNameAndOption(std::string *texname, texture_option_t *texopt,
                               const char *linebuf) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-texres", 7)) && IS_SPACE((token[7]))) {
      token += 7;
      // TODO(syoyo): Check if arg is int type.
      texopt->texture_resolution = parseInt(&token);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else if ((0 == strncmp(token, "-colorspace", 11)) &&
               IS_SPACE((token[11]))) {
      token += 12;
      texopt->colorspace = parseString(&token);
    } else {
// Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}